

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O3

void __thiscall Path::arc_to(Path *this,Point r,float rotation,bool large_arc,bool sweep,Point *end)

{
  Point PVar1;
  pointer pSVar2;
  pointer pPVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float local_d8;
  Point local_a8;
  Point local_40;
  Transformation local_38;
  
  fVar9 = r.x;
  fVar10 = r.y;
  if (((fVar9 != 0.0) || (NAN(fVar9))) && ((fVar10 != 0.0 || (NAN(fVar10))))) {
    pSVar2 = (this->subpaths).super__Vector_base<Subpath,_std::allocator<Subpath>_>._M_impl.
             super__Vector_impl_data._M_finish;
    fVar6 = 0.0;
    fVar11 = 0.0;
    if ((this->subpaths).super__Vector_base<Subpath,_std::allocator<Subpath>_>._M_impl.
        super__Vector_impl_data._M_start != pSVar2) {
      if (pSVar2[-1].closed == true) {
        pPVar3 = pSVar2[-1].points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        pPVar3 = pSVar2[-1].points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
      }
      fVar6 = (*pPVar3).x;
      fVar11 = (*pPVar3).y;
    }
    fVar7 = cosf(-rotation);
    fVar8 = sinf(-rotation);
    fVar17 = (fVar6 - end->x) * 0.5;
    fVar15 = (fVar11 - end->y) * 0.5;
    fVar18 = fVar17 * fVar8 + fVar15 * fVar7 + 0.0;
    fVar19 = fVar17 * fVar7 + fVar15 * -fVar8 + 0.0;
    fVar8 = fVar9 * fVar9 * fVar18;
    fVar14 = fVar10 * fVar9 * fVar9 * fVar10;
    fVar20 = fVar10 * fVar10 * fVar19;
    fVar7 = (fVar14 - fVar18 * fVar8) - fVar19 * fVar20;
    if (0.0 <= fVar7) {
      fVar7 = fVar7 / (fVar8 * fVar18 + fVar20 * fVar19);
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      auVar12._0_4_ = fVar9 * fVar18;
      auVar12._4_4_ = -fVar10 * fVar19;
      auVar12._8_4_ = in_XMM0_Dc * (fVar17 * extraout_XMM0_Db_00 + fVar15 * extraout_XMM0_Db + 0.0);
      auVar12._12_4_ =
           in_XMM0_Dd * (fVar17 * extraout_XMM0_Db + fVar15 * -extraout_XMM0_Db_00 + 0.0);
      auVar13._4_4_ = fVar9;
      auVar13._0_4_ = fVar10;
      auVar13._8_4_ = in_XMM0_Dc;
      auVar13._12_4_ = in_XMM0_Dd;
      auVar13 = divps(auVar12,auVar13);
      fVar9 = fVar7 * auVar13._0_4_;
      fVar7 = fVar7 * auVar13._4_4_;
      local_a8 = r;
      if (large_arc == sweep) {
        fVar9 = -fVar9;
        fVar7 = -fVar7;
      }
    }
    else {
      fVar7 = 1.0 - fVar7 / fVar14;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      local_a8.y = fVar10 * fVar7;
      local_a8.x = fVar9 * fVar7;
      fVar9 = 0.0;
      fVar7 = 0.0;
    }
    fVar10 = cosf(rotation);
    fVar8 = sinf(rotation);
    PVar1 = *end;
    fVar14 = (fVar19 - fVar9) * (1.0 / local_a8.x) + (fVar18 - fVar7) * 0.0 + 0.0;
    fVar17 = (-fVar19 - fVar9) * 0.0 + (1.0 / local_a8.y) * (-fVar18 - fVar7);
    fVar20 = (fVar19 - fVar9) * 0.0 + (1.0 / local_a8.y) * (fVar18 - fVar7);
    fVar15 = fVar20 + 0.0;
    fVar14 = acosf(fVar14 / SQRT(fVar14 * fVar14 + fVar15 * fVar15));
    fVar18 = (-fVar19 - fVar9) * (1.0 / local_a8.x) + (-fVar18 - fVar7) * 0.0 + 0.0;
    fVar15 = fVar17 + 0.0;
    fVar15 = acosf(fVar18 / SQRT(fVar18 * fVar18 + fVar15 * fVar15));
    uVar4 = -(uint)(fVar17 < 0.0);
    uVar5 = -(uint)(fVar20 < 0.0);
    fVar14 = (float)(~uVar5 & (uint)fVar14 | (uint)-fVar14 & uVar5);
    local_d8 = (float)(~uVar4 & (uint)fVar15 | (uint)-fVar15 & uVar4) - fVar14;
    if (0.0 < local_d8 && !sweep) {
      local_d8 = local_d8 + -6.2831855;
    }
    else if (sweep && local_d8 < 0.0) {
      local_d8 = local_d8 + 6.2831855;
    }
    fVar15 = cosf(rotation);
    fVar17 = sinf(rotation);
    fVar20 = fVar15 + fVar17 * 0.0;
    fVar16 = fVar15 * 0.0 + fVar17;
    fVar18 = fVar15 * 0.0 - fVar17;
    fVar15 = fVar15 - fVar17 * 0.0;
    fVar17 = fVar18 * 0.0;
    fVar19 = fVar15 * 0.0;
    local_38.a = fVar17 + local_a8.x * fVar20;
    local_38.b = fVar19 + local_a8.x * fVar16;
    local_38.c = local_a8.y * fVar18 + fVar20 * 0.0;
    local_38.d = local_a8.y * fVar15 + fVar16 * 0.0;
    local_38.f = (fVar11 + PVar1.y) * 0.5 + fVar8 * fVar9 + fVar10 * fVar7 + 0.0 +
                 fVar16 * 0.0 + fVar19;
    local_38.e = (fVar6 + PVar1.x) * 0.5 + fVar10 * fVar9 + -fVar8 * fVar7 + 0.0 +
                 fVar20 * 0.0 + fVar17;
    local_40.x = 0.0;
    local_40.y = 0.0;
    add_arc(this,&local_40,1.0,fVar14,local_d8,&local_38);
    return;
  }
  line_to(this,end);
  return;
}

Assistant:

void arc_to(Point r, float rotation, bool large_arc, bool sweep, const Point& end) {
		if (r.x == 0.f || r.y == 0.f) {
			line_to(end);
			return;
		}
		const Point& start = current_point();
		const Point p = Transformation::rotate(-rotation) * ((start - end) * .5f);
		Point c(0.f, 0.f);
		const float numerator = (r.x*r.x * r.y*r.y - r.x*r.x * p.y*p.y - r.y*r.y * p.x*p.x);
		if (numerator < 0.f) {
			r = r * std::sqrt(1.f - numerator / (r.x*r.x * r.y*r.y));
		}
		else {
			const float denominator = (r.x*r.x * p.y*p.y + r.y*r.y * p.x*p.x);
			c = Point(r.x*p.y/r.y, -r.y*p.x/r.x) * std::sqrt(numerator / denominator);
			if (large_arc == sweep) {
				c = c * -1.f;
			}
		}
		const Point center = Transformation::rotate(rotation) * c + (start + end) * .5f;
		const float start_angle = angle(Transformation::scale(1.f / r.x, 1.f / r.y) * (p - c));
		const float end_angle = angle(Transformation::scale(1.f / r.x, 1.f / r.y) * (-p - c));
		float sweep_angle = end_angle - start_angle;
		if (sweep == false && sweep_angle > 0.f) {
			sweep_angle -= 2.f * M_PI;
		}
		else if (sweep == true && sweep_angle < 0.f) {
			sweep_angle += 2.f * M_PI;
		}
		const Transformation t = Transformation::translate(center.x, center.y) * Transformation::rotate(rotation) * Transformation::scale(r.x, r.y);
		add_arc(Point(0.f, 0.f), 1.f, start_angle, sweep_angle, t);
	}